

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<25UL> * __thiscall
mserialize::cx_strcat<16ul,7ul,1ul,1ul>
          (cx_string<25UL> *__return_storage_ptr__,mserialize *this,cx_string<16UL> *strings,
          cx_string<7UL> *strings_1,cx_string<1UL> *strings_2,cx_string<1UL> *strings_3)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong auStack_88 [6];
  long lStack_58;
  mserialize *local_50;
  cx_string<16UL> *local_48;
  cx_string<7UL> *local_40;
  cx_string<1UL> *local_38;
  undefined8 uStack_28;
  char buffer [26];
  
  puVar3 = &uStack_28;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x10] = '\0';
  uStack_28 = 0;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_50 = this;
  local_48 = strings;
  local_40 = strings_1;
  local_38 = strings_2;
  auStack_88[1] = 0x10;
  auStack_88[2] = 7;
  lVar1 = 1;
  auStack_88[3] = 1;
  auStack_88[4] = 1;
  do {
    if (auStack_88[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_58)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_88[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  __return_storage_ptr__->_data[0x19] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = uStack_28;
  *(ulong *)(__return_storage_ptr__->_data + 8) =
       CONCAT62(buffer._2_6_,CONCAT11(buffer[1],buffer[0]));
  *(ulong *)(__return_storage_ptr__->_data + 9) =
       CONCAT17(buffer[8],CONCAT61(buffer._2_6_,buffer[1]));
  *(ulong *)(__return_storage_ptr__->_data + 0x11) = CONCAT71(buffer._10_7_,buffer[9]);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}